

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.cpp
# Opt level: O2

void __thiscall deqp::SubcaseBase::Documentation(SubcaseBase *this)

{
  TestLog *log;
  char *this_00;
  string fsh2;
  string fsh;
  string gsh2;
  string gsh;
  string tesh2;
  string tesh;
  string tcsh2;
  string tcsh;
  string vsh2;
  string vsh;
  string sStack_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  log = ((this->super_GLWrapper).m_context)->m_testCtx->m_log;
  (*(this->super_GLWrapper)._vptr_GLWrapper[5])(&local_38,this);
  WriteField(log,"Title",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (*(this->super_GLWrapper)._vptr_GLWrapper[6])(&local_58,this);
  WriteField(log,"Purpose",&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  (*(this->super_GLWrapper)._vptr_GLWrapper[7])(&local_78,this);
  WriteField(log,"Method",&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  (*(this->super_GLWrapper)._vptr_GLWrapper[8])(&local_98,this);
  this_00 = "Pass Criteria";
  WriteField(log,"Pass Criteria",&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  VertexShader_abi_cxx11_(&local_b8,(SubcaseBase *)this_00);
  if (local_b8._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_d8,(string *)&local_b8);
    this_00 = "OpenGL vertex shader";
    WriteField(log,"OpenGL vertex shader",&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  VertexShader2_abi_cxx11_(&local_218,(SubcaseBase *)this_00);
  if (local_218._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_f8,(string *)&local_218);
    this_00 = "OpenGL vertex shader 2";
    WriteField(log,"OpenGL vertex shader 2",&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  TessControlShader_abi_cxx11_(&local_238,(SubcaseBase *)this_00);
  if (local_238._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_118,(string *)&local_238);
    this_00 = "OpenGL tessellation control shader";
    WriteField(log,"OpenGL tessellation control shader",&local_118);
    std::__cxx11::string::~string((string *)&local_118);
  }
  TessControlShader_abi_cxx11_(&local_258,(SubcaseBase *)this_00);
  if (local_258._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_138,(string *)&local_258);
    this_00 = "OpenGL tessellation control shader 2";
    WriteField(log,"OpenGL tessellation control shader 2",&local_138);
    std::__cxx11::string::~string((string *)&local_138);
  }
  TessControlShader_abi_cxx11_(&local_278,(SubcaseBase *)this_00);
  if (local_278._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_158,(string *)&local_278);
    this_00 = "OpenGL tessellation evaluation shader";
    WriteField(log,"OpenGL tessellation evaluation shader",&local_158);
    std::__cxx11::string::~string((string *)&local_158);
  }
  TessControlShader_abi_cxx11_(&local_298,(SubcaseBase *)this_00);
  if (local_298._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_178,(string *)&local_298);
    this_00 = "OpenGL tessellation evaluation shader 2";
    WriteField(log,"OpenGL tessellation evaluation shader 2",&local_178);
    std::__cxx11::string::~string((string *)&local_178);
  }
  GeometryShader_abi_cxx11_(&local_2b8,(SubcaseBase *)this_00);
  if (local_2b8._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_198,(string *)&local_2b8);
    this_00 = "OpenGL geometry shader";
    WriteField(log,"OpenGL geometry shader",&local_198);
    std::__cxx11::string::~string((string *)&local_198);
  }
  GeometryShader2_abi_cxx11_(&local_2d8,(SubcaseBase *)this_00);
  if (local_2d8._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_1b8,(string *)&local_2d8);
    this_00 = "OpenGL geometry shader 2";
    WriteField(log,"OpenGL geometry shader 2",&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
  }
  FragmentShader_abi_cxx11_(&local_2f8,(SubcaseBase *)this_00);
  if (local_2f8._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_1d8,(string *)&local_2f8);
    this_00 = "OpenGL fragment shader";
    WriteField(log,"OpenGL fragment shader",&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  FragmentShader2_abi_cxx11_(&sStack_318,(SubcaseBase *)this_00);
  if (sStack_318._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_1f8,(string *)&sStack_318);
    WriteField(log,"OpenGL fragment shader 2",&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  std::__cxx11::string::~string((string *)&sStack_318);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_b8);
  return;
}

Assistant:

void SubcaseBase::Documentation()
{
	using namespace std;
	using tcu::TestLog;
	TestLog& log = m_context.getTestContext().getLog();

	WriteField(log, "Title", Title());
	WriteField(log, "Purpose", Purpose());
	WriteField(log, "Method", Method());
	WriteField(log, "Pass Criteria", PassCriteria());

	//OpenGL fields
	string vsh = VertexShader();
	if (!vsh.empty())
		WriteField(log, "OpenGL vertex shader", vsh);

	string vsh2 = VertexShader2();
	if (!vsh2.empty())
		WriteField(log, "OpenGL vertex shader 2", vsh2);

	string tcsh = TessControlShader();
	if (!tcsh.empty())
		WriteField(log, "OpenGL tessellation control shader", tcsh);

	string tcsh2 = TessControlShader();
	if (!tcsh2.empty())
		WriteField(log, "OpenGL tessellation control shader 2", tcsh2);

	string tesh = TessControlShader();
	if (!tesh.empty())
		WriteField(log, "OpenGL tessellation evaluation shader", tesh);

	string tesh2 = TessControlShader();
	if (!tesh2.empty())
		WriteField(log, "OpenGL tessellation evaluation shader 2", tesh2);

	string gsh = GeometryShader();
	if (!gsh.empty())
		WriteField(log, "OpenGL geometry shader", gsh);

	string gsh2 = GeometryShader2();
	if (!gsh2.empty())
		WriteField(log, "OpenGL geometry shader 2", gsh2);

	string fsh = FragmentShader();
	if (!fsh.empty())
		WriteField(log, "OpenGL fragment shader", fsh);

	string fsh2 = FragmentShader2();
	if (!fsh2.empty())
		WriteField(log, "OpenGL fragment shader 2", fsh2);
}